

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progressreporter.cpp
# Opt level: O0

void __thiscall pbrt::ProgressReporter::Done(ProgressReporter *this)

{
  bool bVar1;
  long in_RDI;
  __atomic_base<long> *unaff_retaddr;
  bool fa;
  memory_order in_stack_00000038;
  bool in_stack_0000003f;
  bool *in_stack_00000040;
  atomic<bool> *in_stack_00000048;
  undefined1 __i;
  undefined7 in_stack_fffffffffffffff0;
  undefined1 uVar2;
  long __i_00;
  
  if ((*(byte *)(in_RDI + 0x28) & 1) == 0) {
    uVar2 = 0;
    __i_00 = in_RDI;
    bVar1 = std::atomic<bool>::compare_exchange_strong
                      (in_stack_00000048,in_stack_00000040,in_stack_0000003f,in_stack_00000038);
    __i = (undefined1)((ulong)in_RDI >> 0x38);
    if (bVar1) {
      std::__atomic_base<long>::operator=(unaff_retaddr,__i_00);
      std::atomic<bool>::operator=
                ((atomic<bool> *)CONCAT17(uVar2,in_stack_fffffffffffffff0),(bool)__i);
      bVar1 = std::thread::joinable((thread *)CONCAT17(uVar2,in_stack_fffffffffffffff0));
      if (bVar1) {
        std::thread::join();
      }
      printf("\n");
    }
  }
  return;
}

Assistant:

void ProgressReporter::Done() {
    if (!quiet) {
#ifdef PBRT_BUILD_GPU_RENDERER
        if (gpuEvents.size()) {
            CHECK_EQ(gpuEventsLaunchedOffset.load(), gpuEvents.size());
            while (gpuEventsFinishedOffset < gpuEventsLaunchedOffset) {
                cudaError_t err =
                    cudaEventSynchronize(gpuEvents[gpuEventsFinishedOffset]);
                if (err != cudaSuccess)
                    LOG_FATAL("CUDA error: %s", cudaGetErrorString(err));
            }
            workDone = gpuEventsFinishedOffset;
        }
#endif

        // Only let one thread shut things down.
        bool fa = false;
        if (exitThread.compare_exchange_strong(fa, true)) {
            workDone = totalWork;
            exitThread = true;
            if (updateThread.joinable())
                updateThread.join();
            printf("\n");
        }
    }
}